

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode multi_do(connectdata **connp,_Bool *done)

{
  Curl_easy *pCVar1;
  Curl_easy *data;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  connectdata **connp_local;
  
  conn._4_4_ = CURLE_OK;
  data = (Curl_easy *)*connp;
  pCVar1 = data->next;
  if (((Curl_handler *)(data->set).ssl.primary.version_max)->do_it !=
      (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
    conn._4_4_ = (*((Curl_handler *)(data->set).ssl.primary.version_max)->do_it)
                           ((connectdata *)data,done);
    if ((conn._4_4_ == CURLE_SEND_ERROR) && (((ulong)(data->set).source_postquote & 0x10000) != 0))
    {
      if (pCVar1->multi != (Curl_multi *)0x0) {
        return CURLE_SEND_ERROR;
      }
      conn._4_4_ = multi_reconnect_request(connp);
      if (conn._4_4_ == CURLE_OK) {
        data = (Curl_easy *)*connp;
        conn._4_4_ = (*((Curl_handler *)(data->set).ssl.primary.version_max)->do_it)
                               ((connectdata *)data,done);
      }
    }
    if ((conn._4_4_ == CURLE_OK) && ((*done & 1U) != 0)) {
      do_complete((connectdata *)data);
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode multi_do(struct connectdata **connp, bool *done)
{
  CURLcode result=CURLE_OK;
  struct connectdata *conn = *connp;
  struct Curl_easy *data = conn->data;

  if(conn->handler->do_it) {
    /* generic protocol-specific function pointer set in curl_connect() */
    result = conn->handler->do_it(conn, done);

    /* This was formerly done in transfer.c, but we better do it here */
    if((CURLE_SEND_ERROR == result) && conn->bits.reuse) {
      /*
       * If the connection is using an easy handle, call reconnect
       * to re-establish the connection.  Otherwise, let the multi logic
       * figure out how to re-establish the connection.
       */
      if(!data->multi) {
        result = multi_reconnect_request(connp);

        if(!result) {
          /* ... finally back to actually retry the DO phase */
          conn = *connp; /* re-assign conn since multi_reconnect_request
                            creates a new connection */
          result = conn->handler->do_it(conn, done);
        }
      }
      else
        return result;
    }

    if(!result && *done)
      /* do_complete must be called after the protocol-specific DO function */
      do_complete(conn);
  }
  return result;
}